

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tftp.c
# Opt level: O0

char * tftp_option_get(char *buf,size_t len,char **option,char **value)

{
  size_t sVar1;
  ulong uVar2;
  size_t sVar3;
  size_t loc;
  char **value_local;
  char **option_local;
  size_t len_local;
  char *buf_local;
  
  sVar1 = tftp_strnlen(buf,len);
  uVar2 = sVar1 + 1;
  if (uVar2 < len) {
    *option = buf;
    sVar1 = tftp_strnlen(buf + uVar2,len - uVar2);
    uVar2 = sVar1 + uVar2 + 1;
    if (len < uVar2) {
      buf_local = (char *)0x0;
    }
    else {
      sVar3 = strlen(*option);
      *value = buf + sVar3 + 1;
      buf_local = buf + uVar2;
    }
  }
  else {
    buf_local = (char *)0x0;
  }
  return buf_local;
}

Assistant:

static const char *tftp_option_get(const char *buf, size_t len,
                                   const char **option, const char **value)
{
  size_t loc;

  loc = tftp_strnlen(buf, len);
  loc++; /* NULL term */

  if(loc >= len)
    return NULL;
  *option = buf;

  loc += tftp_strnlen(buf + loc, len-loc);
  loc++; /* NULL term */

  if(loc > len)
    return NULL;
  *value = &buf[strlen(*option) + 1];

  return &buf[loc];
}